

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O1

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleVertexArrayNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Value *pVVar2;
  undefined1 auVar3 [16];
  _Alloc_hider __s2;
  int iVar4;
  Property *prop;
  DataArrayList *vaList;
  ulong uVar5;
  aiVector3D *vectorArray;
  aiColor4D *__s;
  runtime_error *prVar6;
  long lVar7;
  VertexContainer *this_00;
  DataArrayList *pDVar8;
  long lVar9;
  float *pfVar10;
  size_t numItems;
  float fVar11;
  string propName;
  string propKey;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  if (node == (DDLNode *)0x0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"No parent node for name.","");
    std::runtime_error::runtime_error(prVar6,(string *)local_90);
    *(undefined ***)prVar6 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  prop = ODDLParser::DDLNode::getProperties(node);
  if (prop == (Property *)0x0) {
    return;
  }
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  propId2StdString(prop,&local_70,&local_50);
  __s2._M_p = local_50._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    __assert_fail("nullptr != attribName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                  ,0x2ee,"MeshAttribute Assimp::OpenGEX::getAttributeByName(const char *)");
  }
  iVar4 = strncmp(PosToken_abi_cxx11_,local_50._M_dataplus._M_p,DAT_00903648);
  if (iVar4 == 0) {
    iVar4 = 1;
  }
  else {
    iVar4 = strncmp(ColToken_abi_cxx11_,__s2._M_p,DAT_00903668);
    if (iVar4 == 0) {
      iVar4 = 2;
    }
    else {
      iVar4 = strncmp(NormalToken_abi_cxx11_,__s2._M_p,DAT_00903688);
      if (iVar4 == 0) {
        iVar4 = 3;
      }
      else {
        iVar4 = strncmp(TexCoordToken_abi_cxx11_,__s2._M_p,DAT_009036a8);
        iVar4 = (uint)(iVar4 == 0) << 2;
      }
    }
  }
  if (iVar4 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__s2._M_p != paVar1) {
      operator_delete(__s2._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return;
    }
    goto LAB_004c844a;
  }
  vaList = ODDLParser::DDLNode::getDataArrayList(node);
  if (vaList == (DataArrayList *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) goto LAB_004c842e;
    goto LAB_004c843b;
  }
  pVVar2 = vaList->m_dataList;
  lVar9 = -1;
  uVar5 = 0;
  numItems = 0;
  pDVar8 = vaList;
  do {
    uVar5 = uVar5 + (ulong)(pVVar2 != (Value *)0x0) * 0x10;
    numItems = numItems + (pVVar2 != (Value *)0x0);
    pDVar8 = pDVar8->m_next;
    lVar9 = lVar9 + 1;
  } while (pDVar8 != (DataArrayList *)0x0);
  switch(iVar4) {
  case 1:
    this_00 = &this->m_currentVertices;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              (&this_00->m_vertices,numItems);
    goto LAB_004c82b7;
  case 2:
    (this->m_currentVertices).m_numColors = numItems;
    __s = (aiColor4D *)operator_new__(-(ulong)(numItems >> 0x3c != 0) | uVar5);
    if (numItems == 0) {
      (this->m_currentVertices).m_colors = __s;
    }
    else {
      lVar7 = (ulong)(pVVar2 != (Value *)0x0) * 0x10;
      memset(__s,0,lVar9 * lVar7 + lVar7);
      (this->m_currentVertices).m_colors = __s;
      pfVar10 = &__s->a;
      do {
        pVVar2 = vaList->m_dataList;
        if (pVVar2 == (Value *)0x0) {
          __assert_fail("nullptr != vals",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                        ,0x312,"void Assimp::OpenGEX::fillColor4(aiColor4D *, Value *)");
        }
        fVar11 = ODDLParser::Value::getFloat(pVVar2);
        ((aiColor4D *)(pfVar10 + -3))->r = fVar11;
        pVVar2 = pVVar2->m_next;
        if (pVVar2 == (Value *)0x0) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_90,"OpenGEX: Not enough values to fill 4-element color, only 1"
                     ,"");
          std::runtime_error::runtime_error(prVar6,(string *)local_90);
          *(undefined ***)prVar6 = &PTR__runtime_error_0082bce0;
          __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        fVar11 = ODDLParser::Value::getFloat(pVVar2);
        pfVar10[-2] = fVar11;
        pVVar2 = pVVar2->m_next;
        if (pVVar2 == (Value *)0x0) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_90,"OpenGEX: Not enough values to fill 4-element color, only 2"
                     ,"");
          std::runtime_error::runtime_error(prVar6,(string *)local_90);
          *(undefined ***)prVar6 = &PTR__runtime_error_0082bce0;
          __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        fVar11 = ODDLParser::Value::getFloat(pVVar2);
        pfVar10[-1] = fVar11;
        if (pVVar2->m_next == (Value *)0x0) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_90,"OpenGEX: Not enough values to fill 4-element color, only 3"
                     ,"");
          std::runtime_error::runtime_error(prVar6,(string *)local_90);
          *(undefined ***)prVar6 = &PTR__runtime_error_0082bce0;
          __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        fVar11 = ODDLParser::Value::getFloat(pVVar2->m_next);
        *pfVar10 = fVar11;
        pfVar10 = pfVar10 + 4;
        numItems = numItems - 1;
      } while (numItems != 0);
    }
    break;
  case 3:
    this_00 = (VertexContainer *)&(this->m_currentVertices).m_normals;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_00,numItems);
LAB_004c82b7:
    copyVectorArray(numItems,vaList,
                    (this_00->m_vertices).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    break;
  case 4:
    (this->m_currentVertices).m_numUVComps[0] = numItems;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = numItems;
    uVar5 = 0xffffffffffffffff;
    if (SUB168(auVar3 * ZEXT816(0xc),8) == 0) {
      uVar5 = SUB168(auVar3 * ZEXT816(0xc),0);
    }
    vectorArray = (aiVector3D *)operator_new__(uVar5);
    if (numItems != 0) {
      lVar7 = 0xc;
      if (pVVar2 == (Value *)0x0) {
        lVar7 = 0;
      }
      uVar5 = lVar7 * lVar9 - 0xc;
      if (pVVar2 != (Value *)0x0) {
        uVar5 = lVar7 * lVar9;
      }
      memset(vectorArray,0,(uVar5 / 0xc) * 0xc + 0xc);
    }
    (this->m_currentVertices).m_textureCoords[0] = vectorArray;
    copyVectorArray(numItems,vaList,vectorArray);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_004c842e:
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
LAB_004c843b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_004c844a:
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void OpenGEXImporter::handleVertexArrayNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node ) {
        throw DeadlyImportError( "No parent node for name." );
        return;
    }

    Property *prop( node->getProperties() );
    if( nullptr != prop ) {
        std::string propName, propKey;
        propId2StdString( prop, propName, propKey );
        MeshAttribute attribType( getAttributeByName( propKey.c_str() ) );
        if( None == attribType ) {
            return;
        }

        DataArrayList *vaList = node->getDataArrayList();
        if( nullptr == vaList ) {
            return;
        }

        const size_t numItems( countDataArrayListItems( vaList ) );

        if( Position == attribType ) {
            m_currentVertices.m_vertices.resize( numItems );
            copyVectorArray( numItems, vaList, m_currentVertices.m_vertices.data() );
        } else if ( Color == attribType ) {
            m_currentVertices.m_numColors = numItems;
            m_currentVertices.m_colors = new aiColor4D[ numItems ];
            copyColor4DArray( numItems, vaList, m_currentVertices.m_colors );
        } else if( Normal == attribType ) {
            m_currentVertices.m_normals.resize( numItems );
            copyVectorArray( numItems, vaList, m_currentVertices.m_normals.data() );
        } else if( TexCoord == attribType ) {
            m_currentVertices.m_numUVComps[ 0 ] = numItems;
            m_currentVertices.m_textureCoords[ 0 ] = new aiVector3D[ numItems ];
            copyVectorArray( numItems, vaList, m_currentVertices.m_textureCoords[ 0 ] );
        }
    }
}